

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O3

int dwarf_get_fde_n(Dwarf_Fde_conflict *fde_data,Dwarf_Unsigned fde_index,
                   Dwarf_Fde_conflict *returned_fde,Dwarf_Error *error)

{
  Dwarf_Fde_conflict pDVar1;
  Dwarf_Debug pDVar2;
  Dwarf_Signed errval;
  
  if (fde_data == (Dwarf_Fde_conflict *)0x0) {
    errval = 100;
  }
  else {
    pDVar1 = *fde_data;
    if (pDVar1 != (Dwarf_Fde_conflict)0x0) {
      pDVar2 = pDVar1->fd_dbg;
      if ((pDVar2 != (Dwarf_Debug)0x0) && (pDVar2->de_magic == 0xebfdebfd)) {
        if (fde_index < (&pDVar2->de_fde_count)[(ulong)(pDVar1->fd_is_eh != '\0') * 2]) {
          *returned_fde = fde_data[fde_index];
          return 0;
        }
        return -1;
      }
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x5d,
                          "DW_DLE_FDE_DBG_NULL: An fde contains a stale Dwarf_Debug ");
      return 1;
    }
    errval = 0x5c;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_get_fde_n(Dwarf_Fde * fde_data,
    Dwarf_Unsigned fde_index,
    Dwarf_Fde * returned_fde, Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Unsigned fdecount = 0;

    if (fde_data == NULL) {
        _dwarf_error(dbg, error, DW_DLE_FDE_PTR_NULL);
        return DW_DLV_ERROR;
    }

    FDE_NULL_CHECKS_AND_SET_DBG(*fde_data, dbg);
    /* Assumes fde_data table has at least one entry. */
    fdecount = fde_data[0]->fd_is_eh?
        dbg->de_fde_count_eh:dbg->de_fde_count;
    if (fde_index >= fdecount) {
        return DW_DLV_NO_ENTRY;
    }
    *returned_fde = (*(fde_data + fde_index));
    return DW_DLV_OK;
}